

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O2

int CfdSetScriptTreeFromString
              (void *handle,void *tree_handle,char *tree_string,char *tapscript,uint8_t leaf_version
              ,char *control_nodes)

{
  bool bVar1;
  reference this;
  CfdException *pCVar2;
  ulong uVar3;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> stack;
  ByteData256 node;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> target_nodes;
  string control_str;
  TapBranch branch;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&control_str,"TapscriptTree",(allocator *)&branch);
  cfd::capi::CheckBuffer(tree_handle,&control_str);
  std::__cxx11::string::~string((string *)&control_str);
  this = std::vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::
         at(*(vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_> **
             )((long)tree_handle + 0x10),0);
  bVar1 = cfd::capi::IsEmptyString(tapscript);
  if (bVar1) {
    cfd::core::TapBranch::TapBranch(&branch);
    bVar1 = cfd::capi::IsEmptyString(tree_string);
    if (!bVar1) {
      std::__cxx11::string::string((string *)&stack,tree_string,(allocator *)&target_nodes);
      cfd::core::TapBranch::FromString((TapBranch *)&control_str,(string *)&stack);
      cfd::core::TapBranch::operator=(&branch,(TapBranch *)&control_str);
      cfd::core::TapBranch::~TapBranch((TapBranch *)&control_str);
      std::__cxx11::string::~string((string *)&stack);
    }
    std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::clear
              (*(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
                ((long)tree_handle + 0x18));
    std::vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>>::
    emplace_back<cfd::core::TapBranch&>
              (*(vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>> **)
                ((long)tree_handle + 0x18),&branch);
    cfd::core::TaprootScriptTree::TaprootScriptTree((TaprootScriptTree *)&control_str);
    cfd::core::TaprootScriptTree::operator=(this,(TaprootScriptTree *)&control_str);
    cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&control_str);
    cfd::core::TapBranch::~TapBranch(&branch);
  }
  else {
    bVar1 = cfd::capi::IsEmptyString(tree_string);
    if (bVar1) {
      control_str._M_dataplus._M_p = "cfdcapi_script.cpp";
      control_str._M_string_length._0_4_ = 0x236;
      control_str.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_74a87b;
      cfd::core::logger::warn<>((CfdSourceLocation *)&control_str,"tree_string is null or empty.");
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&control_str,"Failed to parameter. tree_string is null or empty.",
                 (allocator *)&branch);
      cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&control_str);
      __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    if (leaf_version != 0xc0) {
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&control_str,"Failed to parameter. leaf_version is not support.",
                 (allocator *)&branch);
      cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&control_str);
      __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    std::__cxx11::string::string((string *)&control_str,tapscript,(allocator *)&stack);
    cfd::core::Script::Script((Script *)&branch,&control_str);
    std::__cxx11::string::~string((string *)&control_str);
    target_nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    target_nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    target_nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = cfd::capi::IsEmptyString(control_nodes);
    if (!bVar1) {
      std::__cxx11::string::string((string *)&control_str,control_nodes,(allocator *)&stack);
      if (((uint)control_str._M_string_length & 0x3f) == 0) {
        uVar3 = CONCAT44(control_str._M_string_length._4_4_,(uint)control_str._M_string_length) >> 6
        ;
        while (bVar1 = uVar3 != 0, uVar3 = uVar3 - 1, bVar1) {
          std::__cxx11::string::substr((ulong)&stack,(ulong)&control_str);
          cfd::core::ByteData256::ByteData256(&node,(string *)&stack);
          std::__cxx11::string::~string((string *)&stack);
          std::vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>>::
          emplace_back<cfd::core::ByteData256&>
                    ((vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>> *)
                     &target_nodes,&node);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&node);
        }
      }
      else {
        stack.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        stack.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        stack.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cfd::core::Script::GetData((ByteData *)&node,(Script *)&branch);
        std::vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>>::
        emplace_back<cfd::core::ByteData_const>
                  ((vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>> *)&stack,
                   (ByteData *)&node);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&node);
        cfd::core::ByteData::ByteData((ByteData *)&node,&control_str);
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
        emplace_back<cfd::core::ByteData>(&stack,(ByteData *)&node);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&node);
        cfd::core::TaprootUtil::ParseTaprootSignData
                  (&stack,(SchnorrSignature *)0x0,(bool *)0x0,(uint8_t *)0x0,(SchnorrPubkey *)0x0,
                   &target_nodes,(Script *)0x0,
                   (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)0x0,
                   (ByteData *)0x0);
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&stack);
      }
      std::__cxx11::string::~string((string *)&control_str);
    }
    std::__cxx11::string::string((string *)&stack,tree_string,(allocator *)&node);
    cfd::core::TaprootScriptTree::FromString
              ((TaprootScriptTree *)&control_str,(string *)&stack,(Script *)&branch,&target_nodes);
    cfd::core::TaprootScriptTree::operator=(this,(TaprootScriptTree *)&control_str);
    cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&control_str);
    std::__cxx11::string::~string((string *)&stack);
    std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::clear
              (*(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
                ((long)tree_handle + 0x18));
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&target_nodes);
    cfd::core::Script::~Script((Script *)&branch);
  }
  return 0;
}

Assistant:

int CfdSetScriptTreeFromString(
    void* handle, void* tree_handle, const char* tree_string,
    const char* tapscript, uint8_t leaf_version, const char* control_nodes) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    auto& tree = buffer->tree_buffer->at(0);

    if (IsEmptyString(tapscript)) {
      TapBranch branch;
      if (!IsEmptyString(tree_string)) {
        branch = TapBranch::FromString(tree_string);
      }
      buffer->branch_buffer->clear();
      buffer->branch_buffer->emplace_back(branch);
      tree = TaprootScriptTree();
    } else if (IsEmptyString(tree_string)) {
      warn(CFD_LOG_SOURCE, "tree_string is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tree_string is null or empty.");
    } else {
      if (leaf_version != TaprootScriptTree::kTapScriptLeafVersion) {
        // TODO(k-matsuzawa): Support in the future.
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. leaf_version is not support.");
      }
      Script tapscript_obj(tapscript);
      std::vector<ByteData256> target_nodes;
      if (!IsEmptyString(control_nodes)) {
        std::string control_str(control_nodes);
        if ((control_str.size() % (cfd::core::kByteData256Length * 2)) == 0) {
          size_t split_size = cfd::core::kByteData256Length * 2;
          size_t max = control_str.size() / split_size;
          for (size_t index = 0; index < max; ++index) {
            size_t offset = index * split_size;
            ByteData256 node(control_str.substr(offset, split_size));
            target_nodes.emplace_back(node);
          }
        } else {  // control block
          std::vector<ByteData> stack;
          stack.emplace_back(tapscript_obj.GetData());
          stack.emplace_back(ByteData(control_str));
          TaprootUtil::ParseTaprootSignData(
              stack, nullptr, nullptr, nullptr, nullptr, &target_nodes,
              nullptr);
        }
      }

      tree = TaprootScriptTree::FromString(
          tree_string, tapscript_obj, target_nodes);
      buffer->branch_buffer->clear();
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}